

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecfactory.cpp
# Opt level: O0

void __thiscall FastPForLib::CODECFactory::CODECFactory(CODECFactory *this)

{
  initializefactory_abi_cxx11_();
  return;
}

Assistant:

CODECFactory::CODECFactory() : scodecmap(initializefactory()) {}